

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_DDictHashSet_emplaceDDict(ZSTD_DDictHashSet *hashSet,ZSTD_DDict *ddict)

{
  ZSTD_DDict *ddict_00;
  uint dictID;
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  
  dictID = ZSTD_getDictID_fromDDict(ddict);
  sVar2 = ZSTD_DDictHashSet_getIndex(hashSet,dictID);
  sVar3 = hashSet->ddictPtrTableSize;
  if (hashSet->ddictPtrCount == sVar3) {
    sVar3 = 0xffffffffffffffff;
  }
  else {
    while( true ) {
      ddict_00 = hashSet->ddictPtrTable[sVar2];
      if (ddict_00 == (ZSTD_DDict *)0x0) break;
      uVar1 = ZSTD_getDictID_fromDDict(ddict_00);
      if (uVar1 == dictID) {
        hashSet->ddictPtrTable[sVar2] = ddict;
        goto LAB_01f8a8c6;
      }
      sVar2 = (sVar2 & sVar3 - 1) + 1;
    }
    hashSet->ddictPtrTable[sVar2] = ddict;
    hashSet->ddictPtrCount = hashSet->ddictPtrCount + 1;
LAB_01f8a8c6:
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

static size_t ZSTD_DDictHashSet_emplaceDDict(ZSTD_DDictHashSet* hashSet, const ZSTD_DDict* ddict) {
    const U32 dictID = ZSTD_getDictID_fromDDict(ddict);
    size_t idx = ZSTD_DDictHashSet_getIndex(hashSet, dictID);
    const size_t idxRangeMask = hashSet->ddictPtrTableSize - 1;
    RETURN_ERROR_IF(hashSet->ddictPtrCount == hashSet->ddictPtrTableSize, GENERIC, "Hash set is full!");
    DEBUGLOG(4, "Hashed index: for dictID: %u is %zu", dictID, idx);
    while (hashSet->ddictPtrTable[idx] != NULL) {
        /* Replace existing ddict if inserting ddict with same dictID */
        if (ZSTD_getDictID_fromDDict(hashSet->ddictPtrTable[idx]) == dictID) {
            DEBUGLOG(4, "DictID already exists, replacing rather than adding");
            hashSet->ddictPtrTable[idx] = ddict;
            return 0;
        }
        idx &= idxRangeMask;
        idx++;
    }
    DEBUGLOG(4, "Final idx after probing for dictID %u is: %zu", dictID, idx);
    hashSet->ddictPtrTable[idx] = ddict;
    hashSet->ddictPtrCount++;
    return 0;
}